

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  CType *pCVar1;
  uint uVar2;
  ulong uVar3;
  CType *pCVar4;
  uint uVar5;
  CTypeID1 *pCVar6;
  
  uVar2 = (uint)name + 0xfb3ee249;
  uVar5 = (uVar2 ^ (uint)name) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  pCVar6 = cts->hash + ((uVar2 >> 0xd ^ uVar5) - (uVar5 >> 0x13) & 0x7f);
  pCVar1 = cts->tab;
  while( true ) {
    uVar3 = (ulong)*pCVar6;
    uVar2 = (uint)*pCVar6;
    if (uVar3 == 0) break;
    pCVar4 = pCVar1 + uVar3;
    if (((GCstr *)pCVar1[uVar3].name.gcptr64 == name) &&
       ((tmask >> (pCVar4->info >> 0x1c) & 1) != 0)) goto LAB_00119868;
    pCVar6 = &pCVar4->next;
  }
  uVar2 = 0;
  pCVar4 = pCVar1;
LAB_00119868:
  *ctp = pCVar4;
  return uVar2;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}